

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_b9799a::cmMacroFunctionBlocker::Replay
          (cmMacroFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *status)

{
  cmMakefile *this_00;
  string *name;
  pointer pbVar1;
  bool bVar2;
  cmMacroHelperCommand f;
  undefined1 auStack_1a8 [16];
  function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
  local_198;
  undefined8 local_170;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_168;
  undefined1 local_158 [24];
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> vStack_140;
  PolicyMap local_128;
  _Alloc_hider local_f0;
  pointer local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  BT<std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>
  local_d0;
  cmListFileContext local_a0;
  
  this_00 = status->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_158,"MACROS",(allocator<char> *)auStack_1a8);
  cmMakefile::AppendProperty
            (this_00,(string *)local_158,
             (this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,false);
  std::__cxx11::string::~string((string *)local_158);
  local_128.Status.super__Base_bitset<7UL>._M_w[4] = 0;
  local_128.Status.super__Base_bitset<7UL>._M_w[5] = 0;
  local_128.Status.super__Base_bitset<7UL>._M_w[2] = 0;
  local_128.Status.super__Base_bitset<7UL>._M_w[3] = 0;
  local_128.Status.super__Base_bitset<7UL>._M_w[0] = 0;
  local_128.Status.super__Base_bitset<7UL>._M_w[1] = 0;
  vStack_140.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_140.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158._16_8_ = (_Base_ptr)0x0;
  vStack_140.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158._0_8_ = (pointer)0x0;
  local_158._8_8_ = (pointer)0x0;
  local_128.Status.super__Base_bitset<7UL>._M_w[6] = 0;
  local_e8 = (pointer)0x0;
  local_e0._M_local_buf[0] = '\0';
  local_f0._M_p = (pointer)&local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_158,&this->Args);
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::_M_move_assign
            (&vStack_140,functions);
  std::__cxx11::string::_M_assign((string *)&local_f0);
  cmMakefile::RecordPolicies(this_00,&local_128);
  local_170 = cmMakefile::GetState(this_00);
  name = (this->Args).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  local_198.super__Function_base._M_manager = (_Manager_type)0x0;
  local_198._M_invoker = (_Invoker_type)0x0;
  local_198.super__Function_base._M_functor._M_unused._M_object = (_Elt_pointer)0x0;
  local_198.super__Function_base._M_functor._8_8_ = (_Elt_pointer)0x0;
  local_198.super__Function_base._M_functor._M_unused._M_object = operator_new(0x88);
  pbVar1 = local_e8;
  (((_Elt_pointer)local_198.super__Function_base._M_functor._M_unused._0_8_)->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)local_158._0_8_;
  (((_Elt_pointer)local_198.super__Function_base._M_functor._M_unused._0_8_)->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_158._8_8_;
  (((_Elt_pointer)local_198.super__Function_base._M_functor._M_unused._0_8_)->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_158._16_8_;
  local_158._0_8_ = 0;
  local_158._8_8_ = 0;
  local_158._16_8_ = (_Base_ptr)0x0;
  (((_Elt_pointer)((long)local_198.super__Function_base._M_functor._M_unused._0_8_ + 0x18))->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       (pointer)vStack_140.
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_start;
  (((_Elt_pointer)((long)local_198.super__Function_base._M_functor._M_unused._0_8_ + 0x18))->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       (pointer)vStack_140.
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_finish;
  (((_Elt_pointer)((long)local_198.super__Function_base._M_functor._M_unused._0_8_ + 0x18))->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)vStack_140.
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  vStack_140.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_140.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_140.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((_Elt_pointer)((long)local_198.super__Function_base._M_functor._M_unused._0_8_ + 0x60))->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_128.Status.super__Base_bitset<7UL>._M_w[6];
  (((_Elt_pointer)((long)local_198.super__Function_base._M_functor._M_unused._0_8_ + 0x48))->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_128.Status.super__Base_bitset<7UL>._M_w[4];
  (((_Elt_pointer)((long)local_198.super__Function_base._M_functor._M_unused._0_8_ + 0x48))->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_128.Status.super__Base_bitset<7UL>._M_w[5];
  (((_Elt_pointer)((long)local_198.super__Function_base._M_functor._M_unused._0_8_ + 0x30))->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_128.Status.super__Base_bitset<7UL>._M_w[2];
  (((_Elt_pointer)((long)local_198.super__Function_base._M_functor._M_unused._0_8_ + 0x48))->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_128.Status.super__Base_bitset<7UL>._M_w[3];
  (((_Elt_pointer)((long)local_198.super__Function_base._M_functor._M_unused._0_8_ + 0x30))->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_128.Status.super__Base_bitset<7UL>._M_w[0];
  (((_Elt_pointer)((long)local_198.super__Function_base._M_functor._M_unused._0_8_ + 0x30))->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_128.Status.super__Base_bitset<7UL>._M_w[1];
  (((_Elt_pointer)((long)local_198.super__Function_base._M_functor._M_unused._0_8_ + 0x60))->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((long)local_198.super__Function_base._M_functor._M_unused._0_8_ + 0x78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p == &local_e0) {
    (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)&((pointer)((long)local_198.super__Function_base._M_functor._M_unused._0_8_ + 0x78))->
          _M_dataplus)->_M_impl).super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]);
    (((_Elt_pointer)((long)local_198.super__Function_base._M_functor._M_unused._0_8_ + 0x78))->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_e0._8_8_;
  }
  else {
    (((_Elt_pointer)((long)local_198.super__Function_base._M_functor._M_unused._0_8_ + 0x60))->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_f0._M_p;
    (((_Elt_pointer)((long)local_198.super__Function_base._M_functor._M_unused._0_8_ + 0x78))->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]);
  }
  local_e8 = (pointer)0x0;
  (((_Elt_pointer)((long)local_198.super__Function_base._M_functor._M_unused._0_8_ + 0x60))->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar1;
  local_e0._M_local_buf[0] = '\0';
  local_198._M_invoker =
       std::
       _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmMacroHelperCommand>
       ::_M_invoke;
  local_198.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmMacroHelperCommand>
       ::_M_manager;
  local_f0._M_p = (pointer)&local_e0;
  cmMakefile::GetBacktrace((cmMakefile *)auStack_1a8);
  cmListFileContext::cmListFileContext(&local_a0,&(this->super_cmFunctionBlocker).StartingContext);
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
            (&local_168,(cmListFileContext *)auStack_1a8);
  BT<std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>
  ::BT(&local_d0,&local_198,(cmListFileBacktrace *)&local_168);
  bVar2 = cmState::AddScriptedCommand((cmState *)local_170,name,&local_d0,this_00);
  BT<std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>
  ::~BT(&local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_168.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  cmListFileContext::~cmListFileContext(&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_1a8 + 8));
  std::_Function_base::~_Function_base(&local_198.super__Function_base);
  cmMacroHelperCommand::~cmMacroHelperCommand((cmMacroHelperCommand *)local_158);
  return bVar2;
}

Assistant:

bool cmMacroFunctionBlocker::Replay(std::vector<cmListFileFunction> functions,
                                    cmExecutionStatus& status)
{
  cmMakefile& mf = status.GetMakefile();
  mf.AppendProperty("MACROS", this->Args[0]);
  // create a new command and add it to cmake
  cmMacroHelperCommand f;
  f.Args = this->Args;
  f.Functions = std::move(functions);
  f.FilePath = this->GetStartingContext().FilePath;
  mf.RecordPolicies(f.Policies);
  return mf.GetState()->AddScriptedCommand(
    this->Args[0],
    BT<cmState::Command>(std::move(f),
                         mf.GetBacktrace().Push(this->GetStartingContext())),
    mf);
}